

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_Versioning.h
# Opt level: O0

void __thiscall Test_Versioning::~Test_Versioning(Test_Versioning *this)

{
  Test_Versioning *this_local;
  
  ~Test_Versioning(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

Q_OBJECT
private slots:
   void TestPrefixSameVersion()
   {
      bool needsUpgrade;
      needsUpgrade = QSimpleUpdater::compareVersions("0.0.1", "0.0.1");
      QVERIFY(!needsUpgrade);
      needsUpgrade = QSimpleUpdater::compareVersions("0.0.1", "v0.0.1");
      QVERIFY(!needsUpgrade);
      needsUpgrade = QSimpleUpdater::compareVersions("v0.0.1", "0.0.1");
      QVERIFY(!needsUpgrade);
      needsUpgrade = QSimpleUpdater::compareVersions("v0.0.1", "v0.0.1");
      QVERIFY(!needsUpgrade);
   }